

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

int wally_elements_pegout_script_size
              (size_t genesis_blockhash_len,size_t mainchain_script_len,size_t sub_pubkey_len,
              size_t whitelistproof_len,size_t *written)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar2 = 1;
  lVar1 = 1;
  if ((0x4b < genesis_blockhash_len) && (lVar1 = 2, 0xff < genesis_blockhash_len)) {
    lVar1 = (ulong)(0xffff < genesis_blockhash_len) * 2 + 3;
  }
  if ((0x4b < mainchain_script_len) && (lVar2 = 2, 0xff < mainchain_script_len)) {
    lVar2 = (ulong)(0xffff < mainchain_script_len) * 2 + 3;
  }
  lVar3 = 1;
  lVar4 = 1;
  if ((0x4b < sub_pubkey_len) && (lVar4 = 2, 0xff < sub_pubkey_len)) {
    lVar4 = (ulong)(0xffff < sub_pubkey_len) * 2 + 3;
  }
  if ((0x4b < whitelistproof_len) && (lVar3 = 2, 0xff < whitelistproof_len)) {
    lVar3 = (ulong)(0xffff < whitelistproof_len) * 2 + 3;
  }
  *written = lVar1 + lVar2 +
             sub_pubkey_len + whitelistproof_len + genesis_blockhash_len + mainchain_script_len +
             lVar4 + lVar3 + 1;
  return 0;
}

Assistant:

int wally_elements_pegout_script_size(size_t genesis_blockhash_len,
                                      size_t mainchain_script_len,
                                      size_t sub_pubkey_len,
                                      size_t whitelistproof_len,
                                      size_t *written)
{
    *written = 1
               + script_get_push_size(genesis_blockhash_len)
               + script_get_push_size(mainchain_script_len)
               + script_get_push_size(sub_pubkey_len)
               + script_get_push_size(whitelistproof_len);
    return WALLY_OK;
}